

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O0

Child * __thiscall Archive::Child::getNext(Child *__return_storage_ptr__,Child *this,bool *error)

{
  uint8_t *puVar1;
  char *pcVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint32_t nextOffset;
  bool *error_local;
  Child *this_local;
  
  uVar4 = this->len + (this->len & 1);
  puVar1 = this->data;
  pcVar2 = std::vector<char,_std::allocator<char>_>::data(this->parent->data);
  puVar3 = (uint8_t *)std::vector<char,_std::allocator<char>_>::size(this->parent->data);
  if (puVar1 + ((ulong)uVar4 - (long)pcVar2) < puVar3) {
    Child(__return_storage_ptr__,this->parent,this->data + uVar4,error);
  }
  else {
    Child(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Archive::Child Archive::Child::getNext(bool& error) const {
  // Members are aligned to even byte boundaries.
  uint32_t nextOffset = len + (len & 1);
  if ((size_t)(data - (const uint8_t*)parent->data.data() + nextOffset) >=
      parent->data.size()) { // End of the archive.
    return Child();
  }
  return Child(parent, data + nextOffset, &error);
}